

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::declareBlock
          (HlslParseContext *this,TSourceLoc *loc,TType *type,TString *instanceName)

{
  _Rb_tree_header *p_Var1;
  TTypeList *typeList;
  _Base_ptr p_Var2;
  TSymbolTable *pTVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  pointer pTVar8;
  TQualifier *pTVar9;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  TString *n;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  TPoolAllocator *pTVar10;
  TString *name;
  TVariable *this_00;
  undefined4 extraout_var_23;
  ulong uVar11;
  _Base_ptr p_Var12;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  bool memberWithLocation;
  ulong uVar16;
  TSourceLoc *pTVar17;
  TQualifier *pTVar18;
  TType *pTVar19;
  HlslParseContext *pHVar20;
  _func_int **pp_Var21;
  _Rb_tree_header *p_Var22;
  TTypeList *pTVar23;
  byte bVar24;
  TType blockType;
  TQualifier local_130;
  TString *local_e0;
  ulong local_d8;
  ulong local_d0;
  TType local_c8;
  undefined4 extraout_var_14;
  undefined4 extraout_var_20;
  
  bVar24 = 0;
  iVar6 = (*type->_vptr_TType[0x25])(type);
  if ((char)iVar6 == '\0') {
LAB_00412b13:
    __assert_fail("isStruct()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                  ,0x9e1,"TTypeList *glslang::TType::getWritableStruct() const");
  }
  if ((type->field_13).structure == (TTypeList *)0x0) {
    __assert_fail("type.getWritableStruct() != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                  ,0x224e,
                  "void glslang::HlslParseContext::declareBlock(const TSourceLoc &, TType &, const TString *)"
                 );
  }
  iVar6 = (*type->_vptr_TType[10])(type);
  uVar7 = *(uint *)(CONCAT44(extraout_var,iVar6) + 8) & 0x7f;
  if (uVar7 - 5 < 2) {
    pHVar20 = (HlslParseContext *)type;
    iVar6 = (*type->_vptr_TType[10])();
    correctUniform(pHVar20,(TQualifier *)CONCAT44(extraout_var_01,iVar6));
  }
  else if (uVar7 == 3) {
    iVar6 = (*type->_vptr_TType[10])(type);
    correctInput(this,(TQualifier *)CONCAT44(extraout_var_02,iVar6));
  }
  else if (uVar7 == 4) {
    iVar6 = (*type->_vptr_TType[10])(type);
    correctOutput(this,(TQualifier *)CONCAT44(extraout_var_00,iVar6));
  }
  local_e0 = instanceName;
  iVar6 = (*type->_vptr_TType[0x25])(type);
  if ((char)iVar6 == '\0') goto LAB_00412b13;
  typeList = (type->field_13).structure;
  pTVar8 = (typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar8) {
    p_Var1 = &(this->ioTypeMap).
              super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    uVar16 = 0;
    do {
      pTVar19 = pTVar8[uVar16].type;
      iVar6 = (*pTVar19->_vptr_TType[10])(pTVar19);
      lVar13 = CONCAT44(extraout_var_03,iVar6);
      uVar7 = (uint)*(ulong *)(lVar13 + 8) & 0x7f;
      if (uVar7 == 0x10) {
        uVar11 = 3;
LAB_0041248d:
        *(ulong *)(lVar13 + 8) = *(ulong *)(lVar13 + 8) & 0xffffffffffffff80 | uVar11;
      }
      else if (uVar7 == 0x11) {
        uVar11 = 4;
        goto LAB_0041248d;
      }
      iVar6 = (*type->_vptr_TType[10])();
      *(ulong *)(lVar13 + 8) =
           *(ulong *)(lVar13 + 8) & 0xffffffffffffff80 |
           (ulong)((uint)*(undefined8 *)(CONCAT44(extraout_var_04,iVar6) + 8) & 0x7f);
      iVar6 = (*pTVar19->_vptr_TType[0x25])(pTVar19);
      if ((char)iVar6 != '\0') {
        iVar6 = (*pTVar19->_vptr_TType[0x25])(pTVar19);
        if ((char)iVar6 == '\0') {
          __assert_fail("isStruct()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                        ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
        }
        pTVar23 = (pTVar19->field_13).structure;
        p_Var2 = (this->ioTypeMap).
                 super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                 ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var12 = &p_Var1->_M_header;
        for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
            p_Var2 = (&p_Var2->_M_left)[*(TTypeList **)(p_Var2 + 1) < pTVar23]) {
          if (*(TTypeList **)(p_Var2 + 1) >= pTVar23) {
            p_Var12 = p_Var2;
          }
        }
        p_Var22 = p_Var1;
        if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
           (p_Var22 = (_Rb_tree_header *)p_Var12,
           pTVar23 < (TTypeList *)((_Rb_tree_header *)p_Var12)->_M_node_count)) {
          p_Var22 = p_Var1;
        }
        iVar6 = (*type->_vptr_TType[10])(type);
        uVar7 = *(uint *)(CONCAT44(extraout_var_05,iVar6) + 8) & 0x7f;
        if (uVar7 - 5 < 2) {
          pHVar20 = (HlslParseContext *)type;
          iVar6 = (*type->_vptr_TType[10])();
          correctUniform(pHVar20,(TQualifier *)CONCAT44(extraout_var_07,iVar6));
          if (p_Var22 != p_Var1) {
            pTVar23 = *(TTypeList **)((long)(p_Var22 + 1) + 0x10);
LAB_004125bb:
            if (pTVar23 != (TTypeList *)0x0) {
              iVar6 = (*pTVar19->_vptr_TType[0x25])(pTVar19);
              if ((char)iVar6 == '\0') {
                __assert_fail("isStruct()",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                              ,0x9e0,"void glslang::TType::setStruct(TTypeList *)");
              }
              (pTVar19->field_13).structure = pTVar23;
            }
          }
        }
        else if (uVar7 == 3) {
          iVar6 = (*type->_vptr_TType[10])();
          correctInput(this,(TQualifier *)CONCAT44(extraout_var_08,iVar6));
          if (p_Var22 != p_Var1) {
            pTVar23 = *(TTypeList **)(p_Var22 + 1);
            goto LAB_004125bb;
          }
        }
        else if (uVar7 == 4) {
          iVar6 = (*type->_vptr_TType[10])();
          correctOutput(this,(TQualifier *)CONCAT44(extraout_var_06,iVar6));
          if (p_Var22 != p_Var1) {
            pTVar23 = *(TTypeList **)((long)(p_Var22 + 1) + 8);
            goto LAB_004125bb;
          }
        }
      }
      uVar16 = (ulong)((int)uVar16 + 1);
      pTVar8 = (typeList->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(typeList->
                                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                    ).
                                    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8 >> 5))
    ;
  }
  iVar6 = (*type->_vptr_TType[10])(type);
  switch(*(uint *)(CONCAT44(extraout_var_09,iVar6) + 8) & 0x7f) {
  case 3:
    pTVar9 = &this->globalInputDefaults;
    break;
  case 4:
    pTVar9 = &this->globalOutputDefaults;
    break;
  case 5:
    pTVar9 = &this->globalUniformDefaults;
    break;
  case 6:
    pTVar9 = &this->globalBufferDefaults;
    break;
  default:
    local_130.semanticName = (char *)0x0;
    local_130._16_1_ = local_130._16_1_ & 0xf0;
    local_130.layoutOffset = -1;
    local_130.layoutAlign = -1;
    local_130.layoutPushConstant = false;
    local_130.layoutBufferReference = false;
    local_130.layoutPassthrough = false;
    local_130.layoutViewportRelative = false;
    local_130.layoutSecondaryViewportRelativeOffset = -0x800;
    local_130.layoutShaderRecord = false;
    local_130.layoutFullQuads = false;
    local_130.layoutQuadDeriv = false;
    local_130.layoutHitObjectShaderRecordNV = false;
    local_130.layoutBindlessSampler = false;
    local_130.layoutBindlessImage = false;
    local_130._44_1_ = 0;
    local_130._28_8_ = local_130._28_8_ & 0xffffffdf8000 | 0xffffffff001fcfff;
    local_130._36_8_ = local_130._36_8_ | 0x1ffffff7fffffff;
    local_130.spirvStorageClass = -1;
    local_130.spirvDecorate = (TSpirvDecorate *)0x0;
    local_130._8_8_ = local_130._8_8_ & 0x400000000;
    goto LAB_0041265c;
  }
  pTVar18 = &local_130;
  for (lVar13 = 10; lVar13 != 0; lVar13 = lVar13 + -1) {
    pTVar18->semanticName = pTVar9->semanticName;
    pTVar9 = (TQualifier *)((long)pTVar9 + (ulong)bVar24 * -0x10 + 8);
    pTVar18 = (TQualifier *)((long)pTVar18 + ((ulong)bVar24 * -2 + 1) * 8);
  }
LAB_0041265c:
  iVar6 = (*type->_vptr_TType[10])(type);
  if ((*(char *)(CONCAT44(extraout_var_10,iVar6) + 0x2d) == '\x01') &&
     (iVar6 = (*type->_vptr_TType[10])(type),
     (*(byte *)(CONCAT44(extraout_var_11,iVar6) + 0x10) & 0xf) == 0)) {
    iVar6 = (*type->_vptr_TType[10])(type);
    *(byte *)(CONCAT44(extraout_var_12,iVar6) + 0x10) =
         *(byte *)(CONCAT44(extraout_var_12,iVar6) + 0x10) & 0xf0 | 3;
  }
  pHVar20 = (HlslParseContext *)type;
  iVar6 = (*type->_vptr_TType[10])();
  mergeObjectLayoutQualifiers(pHVar20,&local_130,(TQualifier *)CONCAT44(extraout_var_13,iVar6),true)
  ;
  pTVar8 = (typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
      super__Vector_impl_data._M_finish == pTVar8) {
    bVar5 = false;
    memberWithLocation = false;
  }
  else {
    local_d0 = local_130._28_8_;
    local_d8 = local_130._36_8_;
    memberWithLocation = false;
    bVar5 = false;
    uVar16 = 0;
    uVar11 = 1;
    do {
      iVar6 = (*(pTVar8[uVar16].type)->_vptr_TType[10])();
      pTVar9 = (TQualifier *)CONCAT44(extraout_var_14,iVar6);
      pTVar17 = &(typeList->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar16].loc;
      if (((char)(*(ulong *)&pTVar9->field_0x1c >> 0x38) != -1) &&
         ((*(ulong *)&pTVar9->field_0x1c ^ local_d0) >> 0x38 != 0)) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar17,"member cannot contradict block","stream","");
      }
      uVar7 = (uint)*(undefined8 *)&pTVar9->field_0x24;
      if (((~uVar7 & 0xf) != 0) && (((uVar7 ^ (uint)local_d8) & 0xf) != 0)) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar17,
                   "member cannot contradict block (or what block inherited from global)",
                   "xfb_buffer","");
      }
      if ((~*(uint *)&pTVar9->field_0x1c & 0xfff) == 0) {
        bVar5 = true;
      }
      else {
        iVar6 = (*type->_vptr_TType[10])();
        if ((*(uint *)(CONCAT44(extraout_var_15,iVar6) + 8) & 0x7f) - 3 < 2) {
          memberWithLocation = true;
        }
      }
      pTVar18 = &local_130;
      pTVar19 = &local_c8;
      for (lVar13 = 10; lVar13 != 0; lVar13 = lVar13 + -1) {
        pTVar19->_vptr_TType = (_func_int **)pTVar18->semanticName;
        pTVar18 = (TQualifier *)((long)pTVar18 + ((ulong)bVar24 * -2 + 1) * 8);
        pTVar19 = (TType *)((long)pTVar19 + (ulong)bVar24 * -0x10 + 8);
      }
      mergeQualifiers(this,(TQualifier *)&local_c8,pTVar9);
      pTVar19 = &local_c8;
      for (lVar13 = 10; lVar13 != 0; lVar13 = lVar13 + -1) {
        pTVar9->semanticName = (char *)pTVar19->_vptr_TType;
        pTVar19 = (TType *)((long)pTVar19 + (ulong)bVar24 * -0x10 + 8);
        pTVar9 = (TQualifier *)((long)pTVar9 + (ulong)bVar24 * -0x10 + 8);
      }
      pTVar8 = (typeList->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      bVar4 = uVar11 < (ulong)((long)(typeList->
                                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                     ).
                                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8 >> 5)
      ;
      uVar16 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar4);
  }
  iVar6 = (*type->_vptr_TType[10])(type);
  fixBlockLocations(this,loc,(TQualifier *)CONCAT44(extraout_var_16,iVar6),typeList,
                    memberWithLocation,bVar5);
  iVar6 = (*type->_vptr_TType[10])(type);
  fixXfbOffsets(this,(TQualifier *)CONCAT44(extraout_var_17,iVar6),typeList);
  iVar6 = (*type->_vptr_TType[10])(type);
  fixBlockUniformOffsets(this,(TQualifier *)CONCAT44(extraout_var_18,iVar6),typeList);
  pHVar20 = (HlslParseContext *)type;
  iVar6 = (*type->_vptr_TType[10])();
  mergeObjectLayoutQualifiers(pHVar20,(TQualifier *)CONCAT44(extraout_var_19,iVar6),&local_130,true)
  ;
  name = local_e0;
  if ((local_e0 == (TString *)0x0) || (n = local_e0, local_e0->_M_string_length == 0)) {
    iVar6 = (*type->_vptr_TType[5])(type);
    n = (TString *)CONCAT44(extraout_var_20,iVar6);
  }
  iVar6 = (*type->_vptr_TType[10])(type);
  TType::TType(&local_c8,typeList,n,(TQualifier *)CONCAT44(extraout_var_21,iVar6));
  iVar6 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar6 != '\0') {
    iVar6 = (*type->_vptr_TType[0x14])(type);
    local_c8.arraySizes = (TArraySizes *)CONCAT44(extraout_var_22,iVar6);
  }
  if (name == (TString *)0x0) {
    pTVar10 = GetThreadPoolAllocator();
    name = (TString *)TPoolAllocator::allocate(pTVar10,0x28);
    pTVar10 = GetThreadPoolAllocator();
    (name->_M_dataplus).super_allocator_type.allocator = pTVar10;
    (name->_M_dataplus)._M_p = (pointer)&name->field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)name,"");
  }
  pTVar10 = GetThreadPoolAllocator();
  this_00 = (TVariable *)TPoolAllocator::allocate(pTVar10,0xf8);
  TVariable::TVariable(this_00,name,name,&local_c8,false);
  bVar5 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_00);
  if (bVar5) {
    pTVar3 = (this->super_TParseContextBase).symbolTable;
    if ((int)((ulong)((long)(pTVar3->table).
                            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pTVar3->table).
                           super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) < 5) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                (this,this_00);
    }
  }
  else {
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(name,"");
    if (iVar6 == 0) {
      pp_Var21 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar15 = "nameless block contains a member that already has a name at global scope";
      pcVar14 = "";
    }
    else {
      iVar6 = (*(this_00->super_TSymbol)._vptr_TSymbol[3])(this_00);
      pcVar14 = *(char **)(CONCAT44(extraout_var_23,iVar6) + 8);
      pp_Var21 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar15 = "block instance name redefinition";
    }
    (*pp_Var21[0x2d])(this,loc,pcVar15,pcVar14,"");
  }
  return;
}

Assistant:

void HlslParseContext::declareBlock(const TSourceLoc& loc, TType& type, const TString* instanceName)
{
    assert(type.getWritableStruct() != nullptr);

    // Clean up top-level decorations that don't belong.
    switch (type.getQualifier().storage) {
    case EvqUniform:
    case EvqBuffer:
        correctUniform(type.getQualifier());
        break;
    case EvqVaryingIn:
        correctInput(type.getQualifier());
        break;
    case EvqVaryingOut:
        correctOutput(type.getQualifier());
        break;
    default:
        break;
    }

    TTypeList& typeList = *type.getWritableStruct();
    // fix and check for member storage qualifiers and types that don't belong within a block
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TType& memberType = *typeList[member].type;
        TQualifier& memberQualifier = memberType.getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;
        globalQualifierFix(memberLoc, memberQualifier);
        memberQualifier.storage = type.getQualifier().storage;

        if (memberType.isStruct()) {
            // clean up and pick up the right set of decorations
            auto it = ioTypeMap.find(memberType.getStruct());
            switch (type.getQualifier().storage) {
            case EvqUniform:
            case EvqBuffer:
                correctUniform(type.getQualifier());
                if (it != ioTypeMap.end() && it->second.uniform)
                    memberType.setStruct(it->second.uniform);
                break;
            case EvqVaryingIn:
                correctInput(type.getQualifier());
                if (it != ioTypeMap.end() && it->second.input)
                    memberType.setStruct(it->second.input);
                break;
            case EvqVaryingOut:
                correctOutput(type.getQualifier());
                if (it != ioTypeMap.end() && it->second.output)
                    memberType.setStruct(it->second.output);
                break;
            default:
                break;
            }
        }
    }

    // Make default block qualification, and adjust the member qualifications

    TQualifier defaultQualification;
    switch (type.getQualifier().storage) {
    case EvqUniform:    defaultQualification = globalUniformDefaults;    break;
    case EvqBuffer:     defaultQualification = globalBufferDefaults;     break;
    case EvqVaryingIn:  defaultQualification = globalInputDefaults;      break;
    case EvqVaryingOut: defaultQualification = globalOutputDefaults;     break;
    default:            defaultQualification.clear();                    break;
    }

    // Special case for "push_constant uniform", which has a default of std430,
    // contrary to normal uniform defaults, and can't have a default tracked for it.
    if (type.getQualifier().layoutPushConstant && ! type.getQualifier().hasPacking())
        type.getQualifier().layoutPacking = ElpStd430;

    // fix and check for member layout qualifiers

    mergeObjectLayoutQualifiers(defaultQualification, type.getQualifier(), true);

    bool memberWithLocation = false;
    bool memberWithoutLocation = false;
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TQualifier& memberQualifier = typeList[member].type->getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;
        if (memberQualifier.hasStream()) {
            if (defaultQualification.layoutStream != memberQualifier.layoutStream)
                error(memberLoc, "member cannot contradict block", "stream", "");
        }

        // "This includes a block's inheritance of the
        // current global default buffer, a block member's inheritance of the block's
        // buffer, and the requirement that any *xfb_buffer* declared on a block
        // member must match the buffer inherited from the block."
        if (memberQualifier.hasXfbBuffer()) {
            if (defaultQualification.layoutXfbBuffer != memberQualifier.layoutXfbBuffer)
                error(memberLoc, "member cannot contradict block (or what block inherited from global)", "xfb_buffer", "");
        }

        if (memberQualifier.hasLocation()) {
            switch (type.getQualifier().storage) {
            case EvqVaryingIn:
            case EvqVaryingOut:
                memberWithLocation = true;
                break;
            default:
                break;
            }
        } else
            memberWithoutLocation = true;

        TQualifier newMemberQualification = defaultQualification;
        mergeQualifiers(newMemberQualification, memberQualifier);
        memberQualifier = newMemberQualification;
    }

    // Process the members
    fixBlockLocations(loc, type.getQualifier(), typeList, memberWithLocation, memberWithoutLocation);
    fixXfbOffsets(type.getQualifier(), typeList);
    fixBlockUniformOffsets(type.getQualifier(), typeList);

    // reverse merge, so that currentBlockQualifier now has all layout information
    // (can't use defaultQualification directly, it's missing other non-layout-default-class qualifiers)
    mergeObjectLayoutQualifiers(type.getQualifier(), defaultQualification, true);

    //
    // Build and add the interface block as a new type named 'blockName'
    //

    // Use the instance name as the interface name if one exists, else the block name.
    const TString& interfaceName = (instanceName && !instanceName->empty()) ? *instanceName : type.getTypeName();

    TType blockType(&typeList, interfaceName, type.getQualifier());
    if (type.isArray())
        blockType.transferArraySizes(type.getArraySizes());

    // Add the variable, as anonymous or named instanceName.
    // Make an anonymous variable if no name was provided.
    if (instanceName == nullptr)
        instanceName = NewPoolTString("");

    TVariable& variable = *new TVariable(instanceName, blockType);
    if (! symbolTable.insert(variable)) {
        if (*instanceName == "")
            error(loc, "nameless block contains a member that already has a name at global scope",
                  "" /* blockName->c_str() */, "");
        else
            error(loc, "block instance name redefinition", variable.getName().c_str(), "");

        return;
    }

    // Save it in the AST for linker use.
    if (symbolTable.atGlobalLevel())
        trackLinkage(variable);
}